

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::GenerateTemplateForOneofString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *descriptor,
          StringPiece proto_ns,StringPiece field_member)

{
  StringPiece value;
  StringPiece value_00;
  StringPiece value_01;
  FieldOptions_CType FVar1;
  FieldOptions *pFVar2;
  char *pcVar3;
  ulong uVar4;
  FieldDescriptor *field;
  char *pcVar5;
  size_type in_R9;
  AlphaNum *in_stack_fffffffffffff568;
  AlphaNum *in_stack_fffffffffffff570;
  SubstituteArg local_a18;
  SubstituteArg local_9e8;
  SubstituteArg local_9b8;
  SubstituteArg local_988;
  SubstituteArg local_958;
  SubstituteArg local_928;
  SubstituteArg local_8f8;
  SubstituteArg local_8c8;
  string local_898;
  SubstituteArg local_878;
  char *local_848;
  SubstituteArg local_830;
  AlphaNum local_800;
  AlphaNum local_7d0;
  AlphaNum local_7a0;
  AlphaNum local_770;
  AlphaNum local_740;
  AlphaNum local_710;
  string local_6e0;
  allocator local_6b9;
  undefined1 local_6b8 [8];
  string default_value_pointer;
  SubstituteArg local_668;
  SubstituteArg local_638;
  SubstituteArg local_608;
  SubstituteArg local_5d8;
  SubstituteArg local_5a8;
  SubstituteArg local_578;
  SubstituteArg local_548;
  SubstituteArg local_518;
  char *local_4e8;
  SubstituteArg local_4d0;
  AlphaNum local_4a0;
  AlphaNum local_470;
  AlphaNum local_440;
  AlphaNum local_410;
  AlphaNum local_3e0;
  string local_3b0;
  undefined4 local_38c;
  SubstituteArg local_388;
  SubstituteArg local_358;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  char *local_1d8;
  SubstituteArg local_1c8;
  AlphaNum local_198;
  AlphaNum local_168;
  AlphaNum local_138;
  AlphaNum local_108;
  AlphaNum local_d8;
  string local_a8;
  allocator local_85 [13];
  undefined1 local_78 [8];
  string field_pointer;
  string field_name;
  FieldDescriptor *descriptor_local;
  StringPiece field_member_local;
  StringPiece proto_ns_local;
  
  pcVar5 = (char *)proto_ns.length_;
  FieldName_abi_cxx11_((string *)((long)&field_pointer.field_2 + 8),(cpp *)this,descriptor);
  pFVar2 = FieldDescriptor::options((FieldDescriptor *)this);
  FVar1 = FieldOptions::ctype(pFVar2);
  pcVar3 = "$0";
  if (FVar1 == FieldOptions_CType_STRING) {
    pcVar3 = "$0.GetPointer()";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,pcVar3,local_85);
  std::allocator<char>::~allocator((allocator<char> *)local_85);
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pFVar2 = FieldDescriptor::options((FieldDescriptor *)this);
    FVar1 = FieldOptions::ctype(pFVar2);
    if (FVar1 == FieldOptions_CType_STRING_PIECE) {
      strings::AlphaNum::AlphaNum(&local_3e0,"_internal_has_");
      strings::AlphaNum::AlphaNum(&local_410,(string *)((long)&field_pointer.field_2 + 8));
      strings::AlphaNum::AlphaNum(&local_440,"() ? ");
      strings::AlphaNum::AlphaNum(&local_470,(string *)local_78);
      strings::AlphaNum::AlphaNum(&local_4a0,": nullptr");
      StrCat_abi_cxx11_(&local_3b0,(protobuf *)&local_3e0,&local_410,&local_440,&local_470,
                        &local_4a0,in_stack_fffffffffffff568);
      value_00.length_ = in_R9;
      value_00.ptr_ = pcVar5;
      local_4e8 = pcVar5;
      strings::internal::SubstituteArg::SubstituteArg(&local_4d0,value_00);
      strings::internal::SubstituteArg::SubstituteArg(&local_518);
      strings::internal::SubstituteArg::SubstituteArg(&local_548);
      strings::internal::SubstituteArg::SubstituteArg(&local_578);
      strings::internal::SubstituteArg::SubstituteArg(&local_5a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_608);
      strings::internal::SubstituteArg::SubstituteArg(&local_638);
      strings::internal::SubstituteArg::SubstituteArg(&local_668);
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)((long)&default_value_pointer.field_2 + 8));
      strings::Substitute(__return_storage_ptr__,&local_3b0,&local_4d0,&local_518,&local_548,
                          &local_578,&local_5a8,&local_5d8,&local_608,&local_638,&local_668,
                          (SubstituteArg *)((long)&default_value_pointer.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_3b0);
      local_38c = 1;
    }
    else {
      pFVar2 = FieldDescriptor::options((FieldDescriptor *)this);
      FVar1 = FieldOptions::ctype(pFVar2);
      pcVar3 = "&$1";
      if (FVar1 == FieldOptions_CType_STRING) {
        pcVar3 = "&$1.get()";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_6b8,pcVar3,&local_6b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
      strings::AlphaNum::AlphaNum(&local_710,"_internal_has_");
      strings::AlphaNum::AlphaNum(&local_740,(string *)((long)&field_pointer.field_2 + 8));
      strings::AlphaNum::AlphaNum(&local_770,"() ? ");
      strings::AlphaNum::AlphaNum(&local_7a0,(string *)local_78);
      strings::AlphaNum::AlphaNum(&local_7d0," : ");
      strings::AlphaNum::AlphaNum(&local_800,(string *)local_6b8);
      StrCat_abi_cxx11_(&local_6e0,(protobuf *)&local_710,&local_740,&local_770,&local_7a0,
                        &local_7d0,&local_800,in_stack_fffffffffffff570);
      value.length_ = in_R9;
      value.ptr_ = pcVar5;
      local_848 = pcVar5;
      strings::internal::SubstituteArg::SubstituteArg(&local_830,value);
      MakeDefaultName_abi_cxx11_(&local_898,(cpp *)this,field);
      strings::internal::SubstituteArg::SubstituteArg(&local_878,&local_898);
      strings::internal::SubstituteArg::SubstituteArg(&local_8c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_8f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_928);
      strings::internal::SubstituteArg::SubstituteArg(&local_958);
      strings::internal::SubstituteArg::SubstituteArg(&local_988);
      strings::internal::SubstituteArg::SubstituteArg(&local_9b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_9e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_a18);
      strings::Substitute(__return_storage_ptr__,&local_6e0,&local_830,&local_878,&local_8c8,
                          &local_8f8,&local_928,&local_958,&local_988,&local_9b8,&local_9e8,
                          &local_a18);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_6e0);
      local_38c = 1;
      std::__cxx11::string::~string((string *)local_6b8);
    }
  }
  else {
    strings::AlphaNum::AlphaNum(&local_d8,"_internal_has_");
    strings::AlphaNum::AlphaNum(&local_108,(string *)((long)&field_pointer.field_2 + 8));
    strings::AlphaNum::AlphaNum(&local_138,"() ? ");
    strings::AlphaNum::AlphaNum(&local_168,(string *)local_78);
    strings::AlphaNum::AlphaNum(&local_198,": nullptr");
    StrCat_abi_cxx11_(&local_a8,(protobuf *)&local_d8,&local_108,&local_138,&local_168,&local_198,
                      in_stack_fffffffffffff568);
    value_01.length_ = in_R9;
    value_01.ptr_ = pcVar5;
    local_1d8 = pcVar5;
    strings::internal::SubstituteArg::SubstituteArg(&local_1c8,value_01);
    strings::internal::SubstituteArg::SubstituteArg(&local_208);
    strings::internal::SubstituteArg::SubstituteArg(&local_238);
    strings::internal::SubstituteArg::SubstituteArg(&local_268);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_328);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    strings::internal::SubstituteArg::SubstituteArg(&local_388);
    strings::Substitute(__return_storage_ptr__,&local_a8,&local_1c8,&local_208,&local_238,&local_268
                        ,&local_298,&local_2c8,&local_2f8,&local_328,&local_358,&local_388);
    std::__cxx11::string::~string((string *)&local_a8);
    local_38c = 1;
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(field_pointer.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateTemplateForOneofString(const FieldDescriptor* descriptor,
                                           StringPiece proto_ns,
                                           StringPiece field_member) {
  std::string field_name = google::protobuf::compiler::cpp::FieldName(descriptor);
  std::string field_pointer =
      descriptor->options().ctype() == google::protobuf::FieldOptions::STRING
          ? "$0.GetPointer()"
          : "$0";

  if (descriptor->default_value_string().empty()) {
    return strings::Substitute(StrCat("_internal_has_", field_name, "() ? ",
                                         field_pointer, ": nullptr"),
                            field_member);
  }

  if (descriptor->options().ctype() == google::protobuf::FieldOptions::STRING_PIECE) {
    return strings::Substitute(StrCat("_internal_has_", field_name, "() ? ",
                                         field_pointer, ": nullptr"),
                            field_member);
  }

  std::string default_value_pointer =
      descriptor->options().ctype() == google::protobuf::FieldOptions::STRING
          ? "&$1.get()"
          : "&$1";
  return strings::Substitute(
      StrCat("_internal_has_", field_name, "() ? ", field_pointer, " : ",
                   default_value_pointer),
      field_member, MakeDefaultName(descriptor));
}